

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3tokResetCursor(Fts3tokCursor *pCsr)

{
  long *in_RDI;
  Fts3tokTable *pTab;
  
  if (in_RDI[2] != 0) {
    (**(code **)(*(long *)(*in_RDI + 0x18) + 0x20))(in_RDI[2]);
    in_RDI[2] = 0;
  }
  sqlite3_free((void *)0x1d1a25);
  in_RDI[1] = 0;
  in_RDI[4] = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  *(undefined4 *)((long)in_RDI + 0x2c) = 0;
  *(undefined4 *)(in_RDI + 6) = 0;
  *(undefined4 *)((long)in_RDI + 0x34) = 0;
  *(undefined4 *)(in_RDI + 3) = 0;
  return;
}

Assistant:

static void fts3tokResetCursor(Fts3tokCursor *pCsr){
  if( pCsr->pCsr ){
    Fts3tokTable *pTab = (Fts3tokTable *)(pCsr->base.pVtab);
    pTab->pMod->xClose(pCsr->pCsr);
    pCsr->pCsr = 0;
  }
  sqlite3_free(pCsr->zInput);
  pCsr->zInput = 0;
  pCsr->zToken = 0;
  pCsr->nToken = 0;
  pCsr->iStart = 0;
  pCsr->iEnd = 0;
  pCsr->iPos = 0;
  pCsr->iRowid = 0;
}